

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void train(int argc,char **argv)

{
  shared_ptr<fasttext::Args> a;
  FastText fasttext;
  __shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_78 [32];
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::make_shared<fasttext::Args>();
  ::fasttext::Args::parseArgs(local_98._M_ptr,argc,argv);
  _Stack_58 = (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x40);
  _Stack_38._M_ptr = (element_type *)0x0;
  _Stack_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = ZEXT1632((undefined1  [16])_Stack_58);
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_88,&local_98);
  ::fasttext::FastText::train((FastText *)local_78,(shared_ptr<fasttext::Args> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  ::fasttext::FastText::~FastText((FastText *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  return;
}

Assistant:

void train(int argc, char** argv) {
  std::shared_ptr<Args> a = std::make_shared<Args>();
  a->parseArgs(argc, argv);
  FastText fasttext;
  fasttext.train(a);
}